

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

piece_data * __thiscall piece_data::operator=(piece_data *this,piece_data *pd)

{
  unsigned_long uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  uVar1 = (pd->bycolor)._M_elems[1];
  (this->bycolor)._M_elems[0] = (pd->bycolor)._M_elems[0];
  (this->bycolor)._M_elems[1] = uVar1;
  *(undefined8 *)(this->king_sq)._M_elems = *(undefined8 *)(pd->king_sq)._M_elems;
  memmove(&this->color_on,&pd->color_on,0x100);
  memmove(&this->piece_on,&pd->piece_on,0x100);
  uVar2 = *(undefined8 *)((pd->number_of)._M_elems[0]._M_elems + 2);
  uVar3 = *(undefined8 *)((pd->number_of)._M_elems[0]._M_elems + 4);
  uVar4 = *(undefined8 *)(pd->number_of)._M_elems[1]._M_elems;
  uVar5 = *(undefined8 *)((pd->number_of)._M_elems[1]._M_elems + 2);
  uVar6 = *(undefined8 *)((pd->number_of)._M_elems[1]._M_elems + 4);
  *(undefined8 *)(this->number_of)._M_elems[0]._M_elems =
       *(undefined8 *)(pd->number_of)._M_elems[0]._M_elems;
  *(undefined8 *)((this->number_of)._M_elems[0]._M_elems + 2) = uVar2;
  *(undefined8 *)((this->number_of)._M_elems[0]._M_elems + 4) = uVar3;
  *(undefined8 *)(this->number_of)._M_elems[1]._M_elems = uVar4;
  *(undefined8 *)((this->number_of)._M_elems[1]._M_elems + 2) = uVar5;
  *(undefined8 *)((this->number_of)._M_elems[1]._M_elems + 4) = uVar6;
  memmove(&this->bitmap,&pd->bitmap,0x400);
  memmove(&this->piece_idx,&pd->piece_idx,0xc00);
  memmove(&this->square_of,&pd->square_of,0x210);
  return this;
}

Assistant:

piece_data& piece_data::operator=(const piece_data& pd) {
	std::copy(std::begin(pd.bycolor), std::end(pd.bycolor), std::begin(bycolor));
	std::copy(std::begin(pd.king_sq), std::end(pd.king_sq), std::begin(king_sq));
	std::copy(std::begin(pd.color_on), std::end(pd.color_on), std::begin(color_on));
	std::copy(std::begin(pd.piece_on), std::end(pd.piece_on), std::begin(piece_on));
	std::copy(std::begin(pd.number_of), std::end(pd.number_of), std::begin(number_of));
	std::copy(std::begin(pd.bitmap), std::end(pd.bitmap), std::begin(bitmap));
	std::copy(std::begin(pd.piece_idx), std::end(pd.piece_idx), std::begin(piece_idx));
	std::copy(std::begin(pd.square_of), std::end(pd.square_of), std::begin(square_of));
	return (*this);
}